

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::XmlUnitTestResultPrinter::ListTestsMatchingFilter
          (XmlUnitTestResultPrinter *this,
          vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases)

{
  FILE *__stream;
  undefined8 uVar1;
  long in_FS_OFFSET;
  ostream *local_1e8;
  FILE *xmlout;
  vector<testing::TestCase_*,_std::allocator<testing::TestCase_*>_> *test_cases_local;
  XmlUnitTestResultPrinter *this_local;
  stringstream local_198 [8];
  stringstream stream;
  ostream aoStack_188 [376];
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  __stream = (FILE *)OpenFileForWriting(&this->output_file_);
  std::__cxx11::stringstream::stringstream(local_198);
  local_1e8 = (ostream *)0x0;
  if (&stack0x00000000 != (undefined1 *)0x198) {
    local_1e8 = aoStack_188;
  }
  PrintXmlTestsList(local_1e8,test_cases);
  StringStreamToString((string *)&this_local,(stringstream *)local_198);
  uVar1 = std::__cxx11::string::c_str();
  fprintf(__stream,"%s",uVar1);
  std::__cxx11::string::~string((string *)&this_local);
  fclose(__stream);
  std::__cxx11::stringstream::~stringstream(local_198);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void XmlUnitTestResultPrinter::ListTestsMatchingFilter(
    const std::vector<TestCase*>& test_cases) {
  FILE* xmlout = OpenFileForWriting(output_file_);
  std::stringstream stream;
  PrintXmlTestsList(&stream, test_cases);
  fprintf(xmlout, "%s", StringStreamToString(&stream).c_str());
  fclose(xmlout);
}